

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdns.c
# Opt level: O0

void cdns_pkt_from_client(int fd,short what,void *_arg)

{
  int iVar1;
  size_t sVar2;
  server_info *psVar3;
  undefined8 uVar4;
  bool bVar5;
  __suseconds_t *p_Var6;
  uint local_1148;
  int error;
  int i_1;
  int i;
  size_t new_size;
  server_info *svrs [2];
  server_info *svr;
  ulong uStack_1110;
  int relay_fd;
  ssize_t pktlen;
  undefined1 local_1100 [4];
  socklen_t addr_len;
  sockaddr_storage client_addr;
  sockaddr_storage *dest_addr;
  timeval timeout;
  char ip_str [55];
  undefined2 local_1028 [4];
  char buf [4096];
  dns_request *req;
  event_base *base;
  void *_arg_local;
  short what_local;
  int fd_local;
  
  buf[0xff8] = '\0';
  buf[0xff9] = '\0';
  buf[0xffa] = '\0';
  buf[0xffb] = '\0';
  buf[0xffc] = '\0';
  buf[0xffd] = '\0';
  buf[0xffe] = '\0';
  buf[0xfff] = '\0';
  dest_addr = (sockaddr_storage *)(ulong)g_cdns_cfg.timeout;
  timeout.tv_sec = 0;
  svr._4_4_ = -1;
  pktlen._4_4_ = 0x80;
  uStack_1110 = recvfrom(fd,local_1028,0x1000,0,(sockaddr *)local_1100,
                         (socklen_t *)((long)&pktlen + 4));
  if (uStack_1110 != 0xffffffffffffffff) {
    if ((uStack_1110 < 0xd) ||
       (iVar1 = dns_validate_request((char *)local_1028,uStack_1110), iVar1 != 0)) {
      _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cdns.c",0x240
                 ,"cdns_pkt_from_client",0,6,"incomplete or malformed DNS request");
    }
    else {
      sVar2 = dns_append_edns_opt((char *)local_1028,uStack_1110,0x1000);
      if (sVar2 < 0x1001) {
        uStack_1110 = sVar2;
      }
      memset(&new_size,0,0x10);
      new_size = (size_t)choose_server((server_info **)0x0,0);
      if ((server_info *)new_size == (server_info *)0x0) {
        _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cdns.c",
                   0x24d,"cdns_pkt_from_client",0,4,"No valid DNS resolver available");
      }
      else {
        error = 1;
        while( true ) {
          bVar5 = false;
          if ((uint)error < 2) {
            bVar5 = svrs[(long)(error + -1) + -1] != (server_info *)0x0;
          }
          if (!bVar5) break;
          psVar3 = choose_server((server_info **)&new_size,error);
          svrs[(long)error + -1] = psVar3;
          error = error + 1;
        }
        local_1148 = 0;
        while ((local_1148 < 2 &&
               (psVar3 = svrs[(long)(int)local_1148 + -1], psVar3 != (server_info *)0x0))) {
          buf._4088_8_ = calloc(0xb8,1);
          if ((void *)buf._4088_8_ == (void *)0x0) {
            _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cdns.c"
                       ,0x25b,"cdns_pkt_from_client",0,3,"Out of memeory.");
LAB_0010836c:
            if (buf._4088_8_ != 0) {
              if (*(long *)(buf._4088_8_ + 0x90) != 0) {
                event_free(*(undefined8 *)(buf._4088_8_ + 0x90));
              }
              free((void *)buf._4088_8_);
            }
            if (-1 < svr._4_4_) {
              evutil_closesocket(svr._4_4_);
            }
          }
          else {
            *(undefined2 *)(buf._4088_8_ + 8) = 0;
            *(uint16_t *)(buf._4088_8_ + 0xe) = g_cdns_cfg.timeout;
            gettimeofday((timeval *)(buf._4088_8_ + 0x98),(__timezone_ptr_t)0x0);
            *(undefined2 *)(buf._4088_8_ + 0xc) = local_1028[0];
            memcpy((void *)(buf._4088_8_ + 0x10),local_1100,0x80);
            *(server_info **)buf._4088_8_ = psVar3;
            client_addr.__ss_align = *(long *)buf._4088_8_ + 0x10;
            fmt_sockaddr_port((sockaddr *)client_addr.__ss_align,(char *)&timeout.tv_usec,0x37);
            p_Var6 = &timeout.tv_usec;
            _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cdns.c"
                       ,0x267,"cdns_pkt_from_client",0,7,"Forwarding request to %s",p_Var6);
            svr._4_4_ = forward_dns_request((sockaddr *)client_addr.__ss_align,0x80,local_1028,
                                            uStack_1110);
            if (svr._4_4_ == -1) {
              _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cdns.c"
                         ,0x26c,"cdns_pkt_from_client",0,6,"Failed to forward DNS request",p_Var6);
              goto LAB_0010836c;
            }
            gettimeofday((timeval *)(buf._4088_8_ + 0xa8),(__timezone_ptr_t)0x0);
            *(int *)(*(long *)buf._4088_8_ + 0x98) = *(int *)(*(long *)buf._4088_8_ + 0x98) + 1;
            uVar4 = event_new(_arg,svr._4_4_,0x12,cdns_readcb,buf._4088_8_);
            *(undefined8 *)(buf._4088_8_ + 0x90) = uVar4;
            if (*(long *)(buf._4088_8_ + 0x90) == 0) {
              _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cdns.c"
                         ,0x273,"cdns_pkt_from_client",1,3,"event_new",p_Var6);
              goto LAB_0010836c;
            }
            iVar1 = event_add(*(undefined8 *)(buf._4088_8_ + 0x90),&dest_addr);
            if (iVar1 != 0) {
              _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cdns.c"
                         ,0x278,"cdns_pkt_from_client",1,3,"event_add");
              goto LAB_0010836c;
            }
            *(undefined2 *)(buf._4088_8_ + 8) = 1;
          }
          local_1148 = local_1148 + 1;
        }
      }
    }
  }
  return;
}

Assistant:

static void cdns_pkt_from_client(int fd, short what, void *_arg)
{
    struct event_base * base = _arg;
    dns_request * req = NULL;
    char   buf[DEFAULT_BUFFER_SIZE];
    char   ip_str[INET_ADDR_PORT_STRLEN];
    struct timeval timeout = {g_cdns_cfg.timeout, 0};
    struct sockaddr_storage * dest_addr;
    struct sockaddr_storage client_addr;
    socklen_t addr_len;
    ssize_t pktlen;
    int   relay_fd = -1;
    struct server_info * svr, * svrs[MAX_SERVERS_FOR_ONE_QUERY];

    // Receive DNS request and do basic verification
    addr_len = sizeof(client_addr);
    pktlen = recvfrom(fd, &buf[0], sizeof(buf), 0, (struct sockaddr *)&client_addr, &addr_len);
    if (pktlen == -1)
        return;

    if (pktlen <= sizeof(struct dns_header_t) || dns_validate_request(&buf[0], pktlen)) {
        log_error(LOG_INFO, "incomplete or malformed DNS request");
        return;
    }

    // append ENDS OPT
    size_t new_size = dns_append_edns_opt(&buf[0], pktlen, sizeof(buf));
    if (new_size <= sizeof(buf))
        pktlen = new_size;

    // Choose a server to forward DNS request
    memset(svrs, 0, sizeof(svrs));
    svrs[0] = choose_server(NULL, 0);
    if (!svrs[0]) {
        log_error(LOG_WARNING, "No valid DNS resolver available");
        return;
    }
    // Choose additional servers to forward DNS requests
    for (int i = 1; i < SIZEOF_ARRAY(svrs) && svrs[i-1]; i++)
        svrs[i] = choose_server(&svrs[0], i);
    // Forward DNS requests via each chosen server 
    for (int i = 0; i < SIZEOF_ARRAY(svrs); i++) {
        svr = svrs[i];
        if (!svr)
            break;
        /* allocate and initialize request structure */
        req = (dns_request *)calloc(sizeof(dns_request), 1);
        if (!req) {
            log_error(LOG_ERR, "Out of memeory.");
            goto fail;
        }
        req->state = STATE_NEW;
        req->timeout = g_cdns_cfg.timeout;
        gettimeofday(&req->req_recv_time, 0);
        memcpy(&req->id, &buf[0], sizeof(uint16_t));
        memcpy(&req->client_addr, &client_addr, sizeof(client_addr));
        req->server = svr;
        dest_addr = &req->server->addr;

        fmt_sockaddr_port((struct sockaddr *)dest_addr, &ip_str[0], sizeof(ip_str));
        log_error(LOG_DEBUG, "Forwarding request to %s", &ip_str[0]);
        // 1000 ^_^
        /* Forward DNS request to upstream server */
        relay_fd = forward_dns_request((struct sockaddr *)dest_addr, sizeof(*dest_addr), &buf[0], pktlen);
        if (relay_fd == -1) {
            log_error(LOG_INFO, "Failed to forward DNS request");
            goto fail;
        }
        gettimeofday(&req->req_fwd_time, 0);
        req->server->stats.n_req += 1;
        req->resolver = event_new(base, relay_fd, EV_READ | EV_PERSIST, cdns_readcb, req);
        if (!req->resolver) {
            log_errno(LOG_ERR, "event_new");
            goto fail;
        }
        int error = event_add(req->resolver, &timeout);
        if (error) {
            log_errno(LOG_ERR, "event_add");
            goto fail;
        }

        req->state = STATE_REQUEST_SENT;
        continue;

fail:
        if (req) {
            if (req->resolver)
                event_free(req->resolver);
            free(req);
        }
        if (relay_fd >= 0)
            evutil_closesocket(relay_fd);
    }
}